

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.cpp
# Opt level: O2

ReadWrite __thiscall SCSI::Target::CommandState::read_write_specs(CommandState *this)

{
  uint16_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  uVar2 = address(this);
  uVar1 = number_of_blocks(this);
  if (uVar1 == 0) {
    uVar3 = (ulong)((long)(this->data_->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                    (long)(this->data_->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start == 6) << 8;
  }
  else {
    uVar3 = (ulong)uVar1;
  }
  return (ReadWrite)((ulong)uVar2 | uVar3 << 0x20);
}

Assistant:

CommandState::ReadWrite CommandState::read_write_specs() const {
	ReadWrite specs;

	specs.address = address();
	specs.number_of_blocks = number_of_blocks();
	if(!specs.number_of_blocks && (data_.size() == 6)) {
		specs.number_of_blocks = 256;
	}

	return specs;
}